

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

long count_deadends(void)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  __node_base _Var4;
  
  lVar3 = 0;
  for (_Var4._M_nxt = Node::nodes._M_h._M_before_begin._M_nxt;
      _Var4._M_nxt != (_Hash_node_base *)0x0; _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt) {
    bVar1 = Edges::empty((Edges *)(_Var4._M_nxt + 4));
    bVar2 = Edges::empty((Edges *)(_Var4._M_nxt + 7));
    lVar3 = (ulong)bVar2 + (ulong)bVar1 + lVar3;
  }
  return lVar3;
}

Assistant:

long count_deadends() {
    long total_deadends = 0;
    for (auto &node: Node::nodes) {
        if (node.second.left_edges.empty())
            total_deadends++;
        if (node.second.right_edges.empty())
            total_deadends++;
    }
    return total_deadends;
}